

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::EnableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64,
          string *aPSKd,string *aProvisioningUrl)

{
  bool bVar1;
  uint uVar2;
  Error *pEVar3;
  size_type sVar4;
  element_type *peVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar6;
  basic_string_view<char> bVar7;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  JoinerInfo local_3e8;
  JoinerKey local_398;
  ErrorCode local_374;
  Error local_370;
  type_conflict1 local_348;
  anon_class_1_0_00000001 local_342;
  v10 local_341;
  v10 *local_340;
  char *local_338;
  string local_330;
  Error local_310;
  key_type local_2e8;
  anon_class_1_0_00000001 local_2c2;
  v10 local_2c1;
  v10 *local_2c0;
  size_t local_2b8;
  string local_2b0;
  Error local_290;
  ErrorCode local_264;
  Error local_260;
  ByteArray *local_238;
  ByteArray *steeringData;
  CommissionerDataset commDataset;
  undefined1 local_1c8 [8];
  ByteArray joinerId;
  string *aProvisioningUrl_local;
  string *aPSKd_local;
  uint64_t aEui64_local;
  CommissionerApp *pCStack_188;
  JoinerType aType_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_160 [16];
  v10 *local_150;
  ulong local_148;
  v10 *local_140;
  size_t sStack_138;
  string *local_130;
  v10 *local_128;
  v10 **local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  local_118;
  undefined1 local_f8 [16];
  v10 *local_e8;
  char *local_e0;
  string **local_d8;
  v10 *local_d0;
  v10 *local_c8;
  char *pcStack_c0;
  string *local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  Error **local_80;
  undefined1 *local_78;
  Error **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  *local_10;
  
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  aVar6 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )aProvisioningUrl;
  aPSKd_local = (string *)aEui64;
  aEui64_local._4_4_ = aType;
  pCStack_188 = this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  Commissioner::ComputeJoinerId((ByteArray *)local_1c8,(uint64_t)aPSKd_local);
  CommissionerDataset::CommissionerDataset((CommissionerDataset *)&steeringData,&this->mCommDataset)
  ;
  commDataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       commDataset.mNmkpSteeringData.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 0x3f;
  local_238 = GetSteeringData((CommissionerDataset *)&steeringData,aEui64_local._4_4_);
  if (aEui64_local._4_4_ == kMeshCoP) {
    ValidatePSKd(&local_260,aPSKd);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_260);
    local_264 = kNone;
    bVar1 = commissioner::operator!=(pEVar3,&local_264);
    Error::~Error(&local_260);
    if (bVar1) goto LAB_001cb550;
  }
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    EnableJoiner::anon_class_1_0_00000001::operator()(&local_2c2);
    local_120 = &local_2c0;
    local_128 = &local_2c1;
    bVar7 = ::fmt::v10::operator()(local_128);
    local_2b8 = bVar7.size_;
    local_2c0 = (v10 *)bVar7.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_130 = &local_2b0;
    local_140 = local_2c0;
    sStack_138 = local_2b8;
    local_a0 = &local_140;
    local_150 = local_2c0;
    local_148 = local_2b8;
    local_98 = local_150;
    sStack_90 = local_148;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_78 = local_160;
    local_80 = &error;
    local_60 = 0;
    args.field_1.values_ = aVar6.values_;
    args.desc_ = (unsigned_long_long)local_80;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_148;
    local_70 = local_80;
    local_68 = local_80;
    local_58 = local_78;
    ::fmt::v10::vformat_abi_cxx11_(&local_2b0,local_150,fmt,args);
    Error::Error(&local_290,kInvalidState,&local_2b0);
    Error::operator=(__return_storage_ptr__,&local_290);
    Error::~Error(&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  else {
    local_2e8.mType = aEui64_local._4_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_2e8.mId,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    sVar4 = std::
            map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
            ::count(&this->mJoiners,&local_2e8);
    JoinerKey::~JoinerKey(&local_2e8);
    if (sVar4 == 0) {
      Commissioner::AddJoiner(local_238,(ByteArray *)local_1c8);
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mCommissioner);
      (*peVar5->_vptr_Commissioner[0x14])(&local_370,peVar5,&steeringData);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_370);
      local_374 = kNone;
      bVar1 = commissioner::operator!=(pEVar3,&local_374);
      Error::~Error(&local_370);
      if (!bVar1) {
        MergeDataset(&this->mCommDataset,(CommissionerDataset *)&steeringData);
        local_398.mType = aEui64_local._4_4_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_398.mId,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8
                  );
        JoinerInfo::JoinerInfo
                  (&local_3e8,aEui64_local._4_4_,(uint64_t)aPSKd_local,aPSKd,aProvisioningUrl);
        std::
        map<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
        ::emplace<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo>
                  ((map<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
                    *)&this->mJoiners,&local_398,&local_3e8);
        JoinerInfo::~JoinerInfo(&local_3e8);
        JoinerKey::~JoinerKey(&local_398);
      }
    }
    else {
      EnableJoiner::anon_class_1_0_00000001::operator()(&local_342);
      local_a8 = &local_340;
      local_b0 = &local_341;
      bVar7 = ::fmt::v10::operator()(local_b0);
      local_338 = (char *)bVar7.size_;
      local_340 = (v10 *)bVar7.data_;
      ::fmt::v10::detail::check_format_string<int,_unsigned_long_&,_FMT_COMPILE_STRING,_0>();
      local_348 = utils::to_underlying<ot::commissioner::JoinerType>(aEui64_local._4_4_);
      local_b8 = &local_330;
      local_c8 = local_340;
      pcStack_c0 = local_338;
      local_d0 = (v10 *)&local_348;
      local_d8 = &aPSKd_local;
      local_50 = &local_c8;
      local_e8 = local_340;
      local_e0 = local_338;
      local_48 = local_e8;
      pcStack_40 = local_e0;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int,unsigned_long>
                (&local_118,local_d0,(int *)local_d8,(unsigned_long *)local_340);
      local_30 = local_f8;
      local_38 = &local_118;
      local_20 = 0x41;
      args_00.field_1.values_ = aVar6.values_;
      args_00.desc_ = (unsigned_long_long)local_38;
      fmt_00.size_ = 0x41;
      fmt_00.data_ = local_e0;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_330,local_e8,fmt_00,args_00);
      Error::Error(&local_310,kAlreadyExists,&local_330);
      Error::operator=(__return_storage_ptr__,&local_310);
      Error::~Error(&local_310);
      std::__cxx11::string::~string((string *)&local_330);
    }
  }
LAB_001cb550:
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  CommissionerDataset::~CommissionerDataset((CommissionerDataset *)&steeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  if ((joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnableJoiner(JoinerType         aType,
                                    uint64_t           aEui64,
                                    const std::string &aPSKd,
                                    const std::string &aProvisioningUrl)
{
    Error error;
    auto  joinerId    = Commissioner::ComputeJoinerId(aEui64);
    auto  commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    if (aType == JoinerType::kMeshCoP)
    {
        SuccessOrExit(error = ValidatePSKd(aPSKd));
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mJoiners.count({aType, joinerId}) == 0,
                 error = ERROR_ALREADY_EXISTS("joiner(type={}, EUI64={:X}) has already been enabled",
                                              utils::to_underlying(aType), aEui64));

    Commissioner::AddJoiner(steeringData, joinerId);
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    mJoiners.emplace(JoinerKey{aType, joinerId}, JoinerInfo{aType, aEui64, aPSKd, aProvisioningUrl});

exit:
    return error;
}